

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_phi_break(ASMState *as,RegSet blocked,RegSet blockedby,RegSet allow)

{
  uint uVar1;
  Reg up_00;
  uint uVar2;
  Reg up;
  Reg down;
  RegSet candidates;
  RegSet allow_local;
  RegSet blockedby_local;
  RegSet blocked_local;
  ASMState *as_local;
  
  up = blocked & allow;
  if (up != 0) {
    up_00 = ra_pick(as,(blocked ^ 0xffffffff) & allow);
    if ((up & (blockedby ^ 0xffffffff)) != 0) {
      up = up & (blockedby ^ 0xffffffff);
    }
    uVar2 = up >> 0x18 | (up & 0xff0000) >> 8 | (up & 0xff00) << 8 | up << 0x18;
    uVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    ra_rename(as,uVar1 ^ 0x18,up_00);
  }
  return;
}

Assistant:

static void asm_phi_break(ASMState *as, RegSet blocked, RegSet blockedby,
			  RegSet allow)
{
  RegSet candidates = blocked & allow;
  if (candidates) {  /* If this register file has candidates. */
    /* Note: the set for ra_pick cannot be empty, since each register file
    ** has some registers never allocated to PHIs.
    */
    Reg down, up = ra_pick(as, ~blocked & allow);  /* Get a free register. */
    if (candidates & ~blockedby)  /* Optimize shifts, else it's a cycle. */
      candidates = candidates & ~blockedby;
    down = rset_picktop(candidates);  /* Pick candidate PHI register. */
    ra_rename(as, down, up);  /* And rename it to the free register. */
  }
}